

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall Socket::Poll::Private::clear(Private *this)

{
  Item *pIVar1;
  Item *pIVar2;
  code *pcVar3;
  int iVar4;
  Item *pIVar5;
  Item *pIVar6;
  epoll_event ev;
  uint32_t local_14;
  undefined8 local_10;
  
  ::close(this->fd);
  iVar4 = epoll_create1(0x80000);
  this->fd = iVar4;
  pIVar1 = &(this->sockets).endItem;
  for (pIVar5 = (this->sockets)._begin.item; pIVar5 != pIVar1; pIVar5 = pIVar5->next) {
    *pIVar5->cell = (Item *)0x0;
    pIVar5->prev = (this->sockets).freeItem;
    (this->sockets).freeItem = pIVar5;
  }
  (this->sockets)._begin.item = pIVar1;
  (this->sockets).endItem.prev = (Item *)0x0;
  (this->sockets)._size = 0;
  pIVar2 = &(this->selectedSockets).endItem;
  for (pIVar6 = (this->selectedSockets)._begin.item; pIVar6 != pIVar2; pIVar6 = pIVar6->next) {
    *pIVar6->cell = (Item *)0x0;
    pIVar6->prev = (this->selectedSockets).freeItem;
    (this->selectedSockets).freeItem = pIVar6;
  }
  (this->selectedSockets)._begin.item = pIVar2;
  (this->selectedSockets).endItem.prev = (Item *)0x0;
  (this->selectedSockets)._size = 0;
  local_14 = 0x2011;
  local_10 = 0;
  iVar4 = epoll_ctl(iVar4,1,this->eventFd,(epoll_event *)&local_14);
  if (iVar4 != 0) {
    iVar4 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Socket/Socket.cpp"
                          ,0x4ea,"epoll_ctl(fd, EPOLL_CTL_ADD, eventFd, &ev) == 0");
    if (iVar4 != 0) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  return;
}

Assistant:

void Socket::Poll::Private::clear()
{
  ::close(fd);
  fd = epoll_create1(EPOLL_CLOEXEC);
  sockets.clear();
  selectedSockets.clear();
  epoll_event ev;
  ev.events = EPOLLIN | EPOLLRDHUP | EPOLLHUP;
  ev.data.ptr = NULL;
  VERIFY(epoll_ctl(fd, EPOLL_CTL_ADD, eventFd, &ev) == 0);
}